

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::DumpProfiledValue
               (char16 *name,ImplicitCallFlags *loopImplicitCallFlags,uint count)

{
  char16 *pcVar1;
  char16_t *form;
  uint local_20;
  uint i;
  uint count_local;
  ImplicitCallFlags *loopImplicitCallFlags_local;
  char16 *name_local;
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name,(ulong)count);
    for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
      form = L" ";
      if (local_20 != 0 && local_20 % 10 == 0) {
        form = L"\n                          ";
      }
      Output::Print(form);
      pcVar1 = GetImplicitCallFlagsString(loopImplicitCallFlags[local_20]);
      Output::Print(L"%2d:%-4s",(ulong)local_20,pcVar1);
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, ImplicitCallFlags * loopImplicitCallFlags, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%2d:%-4s"), i, GetImplicitCallFlagsString(loopImplicitCallFlags[i]));
            }
            Output::Print(_u("\n"));
        }
    }